

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_external_decode_char
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  cram_block *pcVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar3 = -1;
  if (slice->block_by_id == (cram_block **)0x0) {
    uVar1 = slice->hdr->num_blocks;
    uVar7 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    pcVar4 = (cram_block *)0x0;
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pcVar4 = slice->block[uVar7];
      if (((pcVar4 != (cram_block *)0x0) && (pcVar4->content_type == EXTERNAL)) &&
         (pcVar4->content_id == (c->field_6).huffman.ncodes)) {
        uVar6 = uVar7 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar6 == uVar1) {
      return -1;
    }
    if (pcVar4 == (cram_block *)0x0) {
      return -1;
    }
  }
  else {
    pcVar4 = slice->block_by_id[(c->field_6).huffman.ncodes];
    if (pcVar4 == (cram_block *)0x0) {
      return -(uint)(*out_size != 0);
    }
  }
  iVar2 = pcVar4->idx;
  iVar5 = *out_size + iVar2;
  pcVar4->idx = iVar5;
  if (pcVar4->data != (uchar *)0x0 && iVar5 <= pcVar4->uncomp_size) {
    memcpy(out,pcVar4->data + iVar2,(long)*out_size);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int cram_external_decode_char(cram_slice *slice, cram_codec *c,
			      cram_block *in, char *out,
			      int *out_size) {
    int i;
    char *cp;
    cram_block *b = NULL;

    /* Find the external block */
    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->external.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->external.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    cp = cram_extract_block(b, *out_size);
    if (!cp)
	return -1;

    memcpy(out, cp, *out_size);
    return 0;
}